

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateOneofClear
          (MessageGenerator *this,Printer *p)

{
  ushort *puVar1;
  bool bVar2;
  value_type pOVar3;
  FieldDescriptor *field;
  FieldGenerator *this_00;
  cpp *this_01;
  lts_20250127 *plVar4;
  undefined1 in_R8B;
  Span<const_google::protobuf::io::Printer::Sub> vars;
  string_view input;
  string_view s;
  string_view s_00;
  int i;
  value_type local_1a8;
  Printer *local_1a0;
  Iterator __begin4;
  Formatter format;
  Iterator __end4;
  Iterator __begin3;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v;
  Iterator __end3;
  string local_108;
  Sub local_e8;
  
  i = 0;
  __begin3.descriptor = this->descriptor_;
  __begin3.idx = 0;
  __end3.idx = (__begin3.descriptor)->real_oneof_decl_count_;
  local_1a0 = p;
  __end3.descriptor = __begin3.descriptor;
  while( true ) {
    bVar2 = cpp::operator!=(&__begin3,&__end3);
    if (!bVar2) break;
    pOVar3 = OneOfRangeImpl::Iterator::operator*(&__begin3);
    format.vars_.
    super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_
         = 0;
    format.vars_.
    super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0
    ;
    format.vars_.
    super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
    heap_or_soo_.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
    format.printer_ = p;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"oneofname",(allocator<char> *)&__end4);
    puVar1 = (ushort *)(pOVar3->all_names_).payload_;
    __begin4._0_8_ = ZEXT28(*puVar1);
    __begin4.descriptor = (OneofDescriptor *)((long)puVar1 + ~__begin4._0_8_);
    local_1a8 = pOVar3;
    io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>>
              (&local_e8,&local_108,(basic_string_view<char,_std::char_traits<char>_> *)&__begin4);
    vars.len_ = 1;
    vars.ptr_ = &local_e8;
    io::Printer::WithVars(&v,local_1a0,vars);
    io::Printer::Sub::~Sub(&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    Formatter::operator()<>
              (&format,
               "void $classname$::clear_$oneofname$() {\n// @@protoc_insertion_point(one_of_clear_start:$full_name$)\n"
              );
    p = local_1a0;
    (format.printer_)->indent_ =
         (format.printer_)->indent_ + ((format.printer_)->options_).spaces_per_indent;
    Formatter::operator()<>(&format,"$pbi$::TSanWrite(&_impl_);\n");
    Formatter::operator()<>(&format,"switch ($oneofname$_case()) {\n");
    (format.printer_)->indent_ =
         (format.printer_)->indent_ + ((format.printer_)->options_).spaces_per_indent;
    __begin4._0_8_ = __begin4._0_8_ & 0xffffffff00000000;
    __begin4.descriptor = local_1a8;
    __end4.idx = local_1a8->field_count_;
    __end4.descriptor = local_1a8;
    pOVar3 = local_1a8;
    while( true ) {
      bVar2 = protobuf::internal::operator!=(&__begin4,&__end4);
      if (!bVar2) break;
      field = protobuf::internal::FieldRangeImpl<google::protobuf::OneofDescriptor>::Iterator::
              operator*(&__begin4);
      puVar1 = (ushort *)(field->all_names_).payload_;
      this_01 = (cpp *)(ulong)*puVar1;
      input._M_len = (long)puVar1 + ~(ulong)this_01;
      input._M_str = (char *)0x1;
      UnderscoresToCamelCase_abi_cxx11_(&local_e8.key_,this_01,input,(bool)in_R8B);
      Formatter::operator()(&format,"case k$1$: {\n",&local_e8.key_);
      std::__cxx11::string::~string((string *)&local_e8);
      pOVar3 = (value_type)((format.printer_)->options_).spaces_per_indent;
      (format.printer_)->indent_ = (size_t)(&pOVar3->super_SymbolBase + (format.printer_)->indent_);
      bVar2 = IsStringOrMessage(field);
      if (bVar2) {
        this_00 = FieldGeneratorTable::get(&this->field_generators_,field);
        FieldGenerator::GenerateClearingCode(this_00,p);
      }
      else {
        Formatter::operator()<>(&format,"// No need to clear\n");
      }
      Formatter::operator()<>(&format,"break;\n");
      io::Printer::Outdent(format.printer_);
      Formatter::operator()<>(&format,"}\n");
      __begin4.idx = __begin4.idx + 1;
    }
    puVar1 = (ushort *)(local_1a8->all_names_).payload_;
    plVar4 = (lts_20250127 *)(ulong)*puVar1;
    s._M_len = (long)puVar1 + ~(ulong)plVar4;
    s._M_str = (char *)pOVar3;
    absl::lts_20250127::AsciiStrToUpper_abi_cxx11_(&local_e8.key_,plVar4,s);
    Formatter::operator()(&format,"case $1$_NOT_SET: {\n  break;\n}\n",&local_e8.key_);
    std::__cxx11::string::~string((string *)&local_e8);
    io::Printer::Outdent(format.printer_);
    puVar1 = (ushort *)(local_1a8->all_names_).payload_;
    plVar4 = (lts_20250127 *)(ulong)*puVar1;
    s_00._M_len = (long)puVar1 + ~(ulong)plVar4;
    s_00._M_str = (char *)pOVar3;
    absl::lts_20250127::AsciiStrToUpper_abi_cxx11_(&local_e8.key_,plVar4,s_00);
    Formatter::operator()(&format,"}\n$oneof_case$[$1$] = $2$_NOT_SET;\n",&i,&local_e8.key_);
    std::__cxx11::string::~string((string *)&local_e8);
    io::Printer::Outdent(format.printer_);
    Formatter::operator()<>(&format,"}\n\n");
    i = i + 1;
    absl::lts_20250127::
    Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
    ::~Cleanup(&v);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&format.vars_);
    __begin3.idx = __begin3.idx + 1;
  }
  return;
}

Assistant:

void MessageGenerator::GenerateOneofClear(io::Printer* p) {
  // Generated function clears the active field and union case (e.g. foo_case_).
  int i = 0;
  for (auto oneof : OneOfRange(descriptor_)) {
    Formatter format(p);
    auto v = p->WithVars({{"oneofname", oneof->name()}});

    format(
        "void $classname$::clear_$oneofname$() {\n"
        "// @@protoc_insertion_point(one_of_clear_start:$full_name$)\n");
    format.Indent();
    format("$pbi$::TSanWrite(&_impl_);\n");
    format("switch ($oneofname$_case()) {\n");
    format.Indent();
    for (auto field : FieldRange(oneof)) {
      format("case k$1$: {\n", UnderscoresToCamelCase(field->name(), true));
      format.Indent();
      // We clear only allocated objects in oneofs
      if (!IsStringOrMessage(field)) {
        format("// No need to clear\n");
      } else {
        field_generators_.get(field).GenerateClearingCode(p);
      }
      format("break;\n");
      format.Outdent();
      format("}\n");
    }
    format(
        "case $1$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        absl::AsciiStrToUpper(oneof->name()));
    format.Outdent();
    format(
        "}\n"
        "$oneof_case$[$1$] = $2$_NOT_SET;\n",
        i, absl::AsciiStrToUpper(oneof->name()));
    format.Outdent();
    format(
        "}\n"
        "\n");
    ++i;
  }
}